

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<tinyusdz::value::half>
          (AsciiParser *this,char sep,char end_symbol,
          vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *result)

{
  pointer phVar1;
  iterator iVar2;
  StreamReader *pSVar3;
  bool bVar4;
  ulong uVar5;
  char cVar6;
  half value;
  half value_1;
  half local_52;
  string local_50;
  
  phVar1 = (result->
           super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((result->super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>).
      _M_impl.super__Vector_impl_data._M_finish != phVar1) {
    (result->super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>).
    _M_impl.super__Vector_impl_data._M_finish = phVar1;
  }
  bVar4 = SkipWhitespaceAndNewline(this,true);
  if (bVar4) {
    bVar4 = ReadBasicType(this,&local_52);
    if (bVar4) {
      iVar2._M_current =
           (result->
           super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (result->super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<tinyusdz::value::half,std::allocator<tinyusdz::value::half>>::
        _M_realloc_insert<tinyusdz::value::half_const&>
                  ((vector<tinyusdz::value::half,std::allocator<tinyusdz::value::half>> *)result,
                   iVar2,&local_52);
      }
      else {
        (iVar2._M_current)->value = local_52.value;
        (result->super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>).
        _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
    }
    else {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Not starting with the value of requested type.\n","");
      PushError(this,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    if (bVar4) {
      do {
        pSVar3 = this->_sr;
        if ((pSVar3->length_ <= pSVar3->idx_) || (pSVar3->binary_[pSVar3->idx_] == '\0'))
        goto LAB_003fe8a5;
        bVar4 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar4) {
          return false;
        }
        bVar4 = Char1(this,(char *)&local_52);
        cVar6 = '\x01';
        if (bVar4) {
          if ((char)local_52.value == sep) {
            bVar4 = SkipCommentAndWhitespaceAndNewline(this,true);
            if (bVar4) {
              bVar4 = LookChar1(this,(char *)&local_50);
              cVar6 = ((char)local_50._M_dataplus._M_p == end_symbol) * '\x03';
              if (!bVar4) {
                cVar6 = '\x01';
              }
              if ((char)local_50._M_dataplus._M_p != end_symbol && bVar4) goto LAB_003fe814;
            }
          }
          else {
LAB_003fe814:
            if ((char)local_52.value == sep) {
              cVar6 = '\x01';
              bVar4 = SkipWhitespaceAndNewline(this,true);
              if (bVar4) {
                bVar4 = ReadBasicType(this,(half *)&local_50);
                cVar6 = '\x03';
                if (bVar4) {
                  iVar2._M_current =
                       (result->
                       super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
                  if (iVar2._M_current ==
                      (result->
                      super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                      )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    ::std::vector<tinyusdz::value::half,std::allocator<tinyusdz::value::half>>::
                    _M_realloc_insert<tinyusdz::value::half_const&>
                              ((vector<tinyusdz::value::half,std::allocator<tinyusdz::value::half>>
                                *)result,iVar2,(half *)&local_50);
                  }
                  else {
                    (iVar2._M_current)->value = (uint16_t)local_50._M_dataplus._M_p;
                    (result->
                    super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                    )._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
                  }
                  cVar6 = '\0';
                }
              }
            }
            else {
              pSVar3 = this->_sr;
              cVar6 = '\x03';
              if ((0 < (long)pSVar3->idx_) && (uVar5 = pSVar3->idx_ - 1, uVar5 <= pSVar3->length_))
              {
                pSVar3->idx_ = uVar5;
              }
            }
          }
        }
      } while (cVar6 == '\0');
      if (cVar6 != '\x01') {
LAB_003fe8a5:
        if ((result->
            super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>).
            _M_impl.super__Vector_impl_data._M_start !=
            (result->
            super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>).
            _M_impl.super__Vector_impl_data._M_finish) {
          return true;
        }
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Empty array.\n","");
        PushError(this,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  return false;
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep, const char end_symbol, std::vector<T> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    T value;
    if (!ReadBasicType(&value)) {
      PushError("Not starting with the value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // sep
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == sep) {
      // Look next token
      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == end_symbol) {
        // end
        break;
      }
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    T value;
    if (!ReadBasicType(&value)) {
      break;
    }

    result->push_back(value);


  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}